

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.cc
# Opt level: O0

result __thiscall
dtc::anon_unknown_1::ternary_conditional_operator::operator()(ternary_conditional_operator *this)

{
  int iVar1;
  int iVar2;
  type peVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  byte extraout_DL;
  byte extraout_DL_00;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar4;
  result rVar5;
  undefined8 *local_98;
  bool local_85;
  int local_84;
  undefined8 local_80;
  undefined1 local_78;
  undefined8 local_70;
  result r;
  undefined8 local_50;
  result l;
  result c;
  ternary_conditional_operator *this_local;
  bool local_10;
  
  peVar3 = std::
           unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
           ::operator*(&this->cond);
  iVar1 = (**peVar3->_vptr_expression)();
  l._8_8_ = CONCAT44(extraout_var,iVar1);
  peVar3 = std::
           unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
           ::operator*(&this->lhs);
  r._8_4_ = (**peVar3->_vptr_expression)();
  r._12_4_ = extraout_var_00;
  local_50 = r._8_8_;
  l.first._0_1_ = extraout_DL_00;
  peVar3 = std::
           unique_ptr<dtc::(anonymous_namespace)::expression,_std::default_delete<dtc::(anonymous_namespace)::expression>_>
           ::operator*(&this->rhs);
  iVar2 = (**peVar3->_vptr_expression)();
  local_80 = CONCAT44(extraout_var_01,iVar2);
  local_78 = (undefined1)extraout_RDX;
  if (((((byte)l.first & 1) == 0) || ((extraout_RDX & 1) == 0)) || ((extraout_DL & 1) == 0)) {
    local_84 = 0;
    local_85 = false;
    local_70 = local_80;
    r.first._0_1_ = local_78;
    std::pair<unsigned_long_long,_bool>::pair<int,_bool,_true>
              ((pair<unsigned_long_long,_bool> *)&this_local,&local_84,&local_85);
    uVar4 = extraout_RDX_00;
  }
  else {
    if (CONCAT44(extraout_var,iVar1) == 0) {
      local_98 = &local_70;
    }
    else {
      local_98 = &local_50;
    }
    this_local = (ternary_conditional_operator *)*local_98;
    local_10 = SUB81(local_98[1],0);
    uVar4 = extraout_RDX;
  }
  rVar5._9_7_ = (undefined7)(uVar4 >> 8);
  rVar5.second = local_10;
  rVar5.first = (unsigned_long_long)this_local;
  return rVar5;
}

Assistant:

result operator()() override
	{
		result c = (*cond)();
		result l = (*lhs)();
		result r = (*rhs)();
		if (!(l.second && r.second && c.second))
		{
			return {0, false};
		}
		return c.first ? l : r;
	}